

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::SetSourceStream(h__Writer *this,Rational *edit_rate)

{
  Rational RVar1;
  bool bVar2;
  int iVar3;
  ui32_t uVar4;
  Rational *pRVar5;
  byte_t *pbVar6;
  ui32_t local_104;
  UL local_100;
  UL local_e0;
  string local_c0;
  undefined1 local_a0 [136];
  Rational *edit_rate_local;
  h__Writer *this_local;
  Result_t *result;
  
  edit_rate_local = edit_rate;
  this_local = this;
  bVar2 = ASDCP::MXF::h__WriterState::Test_INIT((h__WriterState *)(edit_rate + 0x6e));
  if (bVar2) {
    pRVar5 = (Rational *)ASDCP::Dictionary::ul((Dictionary *)edit_rate[1],MDD_WAVEssenceClip);
    RVar1 = pRVar5[1];
    edit_rate[0xb9] = *pRVar5;
    edit_rate[0xba] = RVar1;
    *(undefined1 *)((long)&edit_rate[0xba].Denominator + 3) = 1;
    local_a0[0x7f] = 0;
    ASDCP::MXF::h__WriterState::Goto_READY((h__WriterState *)this);
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar3) {
      if (edit_rate[0xb8] == (Rational)0x0) {
        __assert_fail("m_WaveAudioDescriptor",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                      ,0x1a6,
                      "ASDCP::Result_t AS_02::PCM::MXFWriter::h__Writer::SetSourceStream(const ASDCP::Rational &)"
                     );
      }
      uVar4 = MXF::CalcSampleSize((WaveAudioDescriptor *)edit_rate[0xb8]);
      edit_rate[0xbb].Numerator = uVar4;
      pbVar6 = ASDCP::Dictionary::ul((Dictionary *)edit_rate[1],MDD_WAVWrappingClip);
      ASDCP::UL::UL((UL *)&local_c0,pbVar6);
      ASDCP::UL::UL(&local_e0,(byte_t *)(edit_rate + 0xb9));
      pbVar6 = ASDCP::Dictionary::ul((Dictionary *)edit_rate[1],MDD_SoundDataDef);
      ASDCP::UL::UL(&local_100,pbVar6);
      h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>::WriteAS02Header
                ((h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR> *)local_a0,(string *)edit_rate,
                 (UL *)&PCM_PACKAGE_LABEL_abi_cxx11_,&local_c0,(UL *)&SOUND_DEF_LABEL_abi_cxx11_,
                 &local_e0,(Rational *)&local_100,
                 (vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *)((long)edit_rate[99] + 0xf0));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a0);
      Kumu::Result_t::~Result_t((Result_t *)local_a0);
      ASDCP::UL::~UL(&local_100);
      ASDCP::UL::~UL(&local_e0);
      ASDCP::UL::~UL((UL *)&local_c0);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar3) {
        RVar1 = edit_rate[0xb8];
        local_104 = MXF::CalcSampleSize((WaveAudioDescriptor *)RVar1);
        MXF::AS02IndexWriterCBR::SetEditRate
                  ((AS02IndexWriterCBR *)(edit_rate + 0x89),(Rational *)((long)RVar1 + 0x158),
                   &local_104);
      }
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::SetSourceStream(const ASDCP::Rational& edit_rate)
{
  if ( ! m_State.Test_INIT() )
    {
      return RESULT_STATE;
    }

  memcpy(m_EssenceUL, m_Dict->ul(MDD_WAVEssenceClip), SMPTE_UL_LENGTH);
  m_EssenceUL[15] = 1; // set the stream identifier
  Result_t result = m_State.Goto_READY();

  if ( KM_SUCCESS(result) )
    {
      assert(m_WaveAudioDescriptor);
      m_BytesPerSample = AS_02::MXF::CalcSampleSize(*m_WaveAudioDescriptor);
      result = WriteAS02Header(PCM_PACKAGE_LABEL, UL(m_Dict->ul(MDD_WAVWrappingClip)),
			       SOUND_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_SoundDataDef)),
			       m_EssenceDescriptor->SampleRate);

      if ( KM_SUCCESS(result) )
	{
	  this->m_IndexWriter.SetEditRate(m_WaveAudioDescriptor->AudioSamplingRate,
					  AS_02::MXF::CalcSampleSize(*m_WaveAudioDescriptor));
	}
    }

  return result;
}